

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.h
# Opt level: O0

void __thiscall
slang::ast::Delay3Control::visitExprs<slang::analysis::NonProceduralExprVisitor&>
          (Delay3Control *this,ContinuousAssignVisitor *visitor)

{
  Expression *in_RSI;
  ContinuousAssignVisitor *in_RDI;
  
  Expression::visit<slang::analysis::NonProceduralExprVisitor&>(in_RSI,in_RDI);
  if (in_RDI[1].condVars != (SmallVector<netlist::NetlistNode_*,_5UL> *)0x0) {
    Expression::visit<slang::analysis::NonProceduralExprVisitor&>(in_RSI,in_RDI);
  }
  if (in_RDI[2].netlist != (Netlist *)0x0) {
    Expression::visit<slang::analysis::NonProceduralExprVisitor&>(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr1.visit(visitor);
        if (expr2)
            expr2->visit(visitor);
        if (expr3)
            expr3->visit(visitor);
    }